

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O0

void __thiscall eglu::anon_unknown_1::RenderContext::~RenderContext(RenderContext *this)

{
  DynamicLibrary *this_00;
  RenderContext *this_local;
  
  (this->super_GLRenderContext).super_RenderContext._vptr_RenderContext =
       (_func_int **)&PTR__RenderContext_0169c6e0;
  destroy(this);
  if (this->m_window != (NativeWindow *)0x0) {
    (*this->m_window->_vptr_NativeWindow[1])();
  }
  if (this->m_pixmap != (NativePixmap *)0x0) {
    (**(code **)(*(long *)this->m_pixmap + 8))();
  }
  if (this->m_display != (NativeDisplay *)0x0) {
    (*this->m_display->_vptr_NativeDisplay[1])();
  }
  this_00 = this->m_dynamicGLLibrary;
  if (this_00 != (DynamicLibrary *)0x0) {
    de::DynamicLibrary::~DynamicLibrary(this_00);
    operator_delete(this_00,8);
  }
  tcu::RenderTarget::~RenderTarget(&this->m_glRenderTarget);
  GLRenderContext::~GLRenderContext(&this->super_GLRenderContext);
  return;
}

Assistant:

RenderContext::~RenderContext(void)
{
	try
	{
		destroy();
	}
	catch (...)
	{
		// destroy() calls EGL functions that are checked and may throw exceptions
	}

	delete m_window;
	delete m_pixmap;
	delete m_display;
	delete m_dynamicGLLibrary;
}